

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

PmError pm_add_device(char *interf,char *name,int input,void *descriptor,pm_fns_type dictionary)

{
  descriptor_type __dest;
  descriptor_type new_descriptors;
  pm_fns_type dictionary_local;
  void *descriptor_local;
  int input_local;
  char *name_local;
  char *interf_local;
  
  if (pm_descriptor_max <= pm_descriptor_index) {
    __dest = (descriptor_type)pm_alloc((long)(pm_descriptor_max + 0x20) << 6);
    if (__dest == (descriptor_type)0x0) {
      return pmInsufficientMemory;
    }
    if (descriptors != (descriptor_type)0x0) {
      memcpy(__dest,descriptors,(long)pm_descriptor_max << 6);
      free(descriptors);
    }
    pm_descriptor_max = pm_descriptor_max + 0x20;
    descriptors = __dest;
  }
  descriptors[pm_descriptor_index].pub.interf = interf;
  descriptors[pm_descriptor_index].pub.name = name;
  descriptors[pm_descriptor_index].pub.input = input;
  descriptors[pm_descriptor_index].pub.output = (uint)((input != 0 ^ 0xffU) & 1);
  descriptors[pm_descriptor_index].pub.opened = 0;
  descriptors[pm_descriptor_index].descriptor = descriptor;
  descriptors[pm_descriptor_index].internalDescriptor = (void *)0x0;
  descriptors[pm_descriptor_index].dictionary = dictionary;
  pm_descriptor_index = pm_descriptor_index + 1;
  return pmNoData;
}

Assistant:

PmError pm_add_device(char *interf, char *name, int input, 
                      void *descriptor, pm_fns_type dictionary) {
    if (pm_descriptor_index >= pm_descriptor_max) {
        // expand descriptors
        descriptor_type new_descriptors = (descriptor_type) 
            pm_alloc(sizeof(descriptor_node) * (pm_descriptor_max + 32));
        if (!new_descriptors) return pmInsufficientMemory;
        if (descriptors) {
            memcpy(new_descriptors, descriptors, 
                   sizeof(descriptor_node) * pm_descriptor_max);
            free(descriptors);
        }
        pm_descriptor_max += 32;
        descriptors = new_descriptors;
    }
    descriptors[pm_descriptor_index].pub.interf = interf;
    descriptors[pm_descriptor_index].pub.name = name;
    descriptors[pm_descriptor_index].pub.input = input;
    descriptors[pm_descriptor_index].pub.output = !input;

    /* default state: nothing to close (for automatic device closing) */
    descriptors[pm_descriptor_index].pub.opened = FALSE;

    /* ID number passed to win32 multimedia API open */
    descriptors[pm_descriptor_index].descriptor = descriptor;
    
    /* points to PmInternal, allows automatic device closing */
    descriptors[pm_descriptor_index].internalDescriptor = NULL;

    descriptors[pm_descriptor_index].dictionary = dictionary;
    
    pm_descriptor_index++;
    
    return pmNoError;
}